

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O1

void __thiscall
irr::video::CImage::copyToScalingBoxFilter(CImage *this,IImage *target,s32 bias,bool blend)

{
  dimension2d<unsigned_int> dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  float fVar17;
  uint uVar18;
  float fVar19;
  float __x;
  undefined4 extraout_XMM0_Db;
  int iVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  float local_d4;
  uint local_d0;
  uint local_a4;
  CImage *local_a0;
  undefined8 local_98;
  dimension2d<unsigned_int> local_88;
  undefined8 uStack_80;
  ulong local_70;
  IImage *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_88 = target->Size;
  local_70 = (ulong)local_88 >> 0x20;
  if (local_70 != 0) {
    dVar1 = (this->super_IImage).Size;
    auVar20._0_8_ = (ulong)dVar1 & 0xffffffff;
    auVar20._8_4_ = dVar1.Height;
    auVar20._12_4_ = 0;
    auVar24._0_4_ = (float)(SUB168(auVar20 | _DAT_0022e050,0) - (double)DAT_0022e050);
    auVar24._4_4_ = (float)(SUB168(auVar20 | _DAT_0022e050,8) - DAT_0022e050._8_8_);
    auVar24._8_8_ = 0;
    uStack_80 = 0;
    auVar21._0_8_ = (ulong)local_88 & 0xffffffff;
    auVar21._8_4_ = local_88.Height;
    auVar21._12_4_ = 0;
    auVar22._0_4_ = (float)(SUB168(auVar21 | _DAT_0022e050,0) - (double)DAT_0022e050);
    auVar22._4_4_ = (float)(SUB168(auVar21 | _DAT_0022e050,8) - DAT_0022e050._8_8_);
    auVar22._8_8_ = 0;
    local_58 = divps(auVar24,auVar22);
    local_a0 = this;
    local_68 = target;
    fVar17 = ceilf(local_58._0_4_);
    local_98 = CONCAT44(extraout_XMM0_Db,fVar17);
    local_48 = (float)local_58._4_4_;
    fStack_44 = (float)local_58._4_4_;
    fStack_40 = (float)local_58._4_4_;
    fStack_3c = (float)local_58._4_4_;
    fVar17 = ceilf((float)local_58._4_4_);
    uVar18 = (uint)(float)local_98;
    iVar23 = (int)fVar17;
    uVar4 = local_88.Width;
    auVar3._4_4_ = -(uint)(uVar18 == 0);
    auVar3._0_4_ = -(uint)(uVar18 == 0);
    auVar3._8_4_ = -(uint)(iVar23 == 0);
    auVar3._12_4_ = -(uint)(iVar23 == 0);
    uVar5 = movmskpd(extraout_EAX,auVar3);
    local_d4 = 0.0;
    local_d0 = 0;
    do {
      if (uVar4 != 0) {
        fVar17 = floorf(local_d4);
        __x = 0.0;
        uVar10 = 0;
        do {
          fVar19 = floorf(__x);
          iVar11 = 0;
          iVar14 = 0;
          iVar15 = 0;
          iVar13 = 0;
          if ((uVar5 & 1) == 0) {
            local_60 = (ulong)(uint)(int)fVar19;
            iVar13 = 0;
            iVar15 = 0;
            uVar7 = 0;
            iVar14 = 0;
            iVar11 = 0;
            do {
              local_98 = uVar7;
              if ((byte)((byte)uVar5 >> 1) == 0) {
                local_88.Width = (int)local_60 + (int)uVar7;
                uVar16 = (int)fVar17;
                iVar9 = iVar23;
                do {
                  uVar12 = (local_a0->super_IImage).Size.Width - 1;
                  if ((int)local_88.Width < (int)uVar12) {
                    uVar12 = local_88.Width;
                  }
                  uVar8 = (local_a0->super_IImage).Size.Height - 1;
                  if ((int)uVar16 < (int)uVar8) {
                    uVar8 = uVar16;
                  }
                  uVar12 = (*(local_a0->super_IImage)._vptr_IImage[2])
                                     (local_a0,(ulong)uVar12,(ulong)uVar8);
                  iVar13 = iVar13 + (uVar12 >> 0x18);
                  iVar15 = iVar15 + (uVar12 >> 0x10 & 0xff);
                  iVar11 = iVar11 + (uVar12 >> 8 & 0xff);
                  iVar14 = iVar14 + (uVar12 & 0xff);
                  uVar16 = uVar16 + 1;
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
              uVar16 = (int)local_98 + 1;
              uVar7 = (ulong)uVar16;
            } while (uVar16 != uVar18);
          }
          bVar6 = 0;
          if (1 < iVar23 * uVar18) {
            bVar6 = 0;
            uVar16 = iVar23 * uVar18;
            do {
              bVar6 = bVar6 + 1;
              bVar2 = 3 < uVar16;
              uVar16 = uVar16 >> 1;
            } while (bVar2);
          }
          iVar13 = (iVar13 >> (bVar6 & 0x1f)) + bias;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          iVar15 = (iVar15 >> (bVar6 & 0x1f)) + bias;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          uVar16 = (iVar11 >> (bVar6 & 0x1f)) + bias;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          if (0xfe < (int)uVar16) {
            uVar16 = 0xff;
          }
          uVar12 = (iVar14 >> (bVar6 & 0x1f)) + bias;
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          if (0xfe < (int)uVar12) {
            uVar12 = 0xff;
          }
          local_a4 = uVar16 << 8 | uVar12 | iVar15 << 0x10 | iVar13 << 0x18;
          (*local_68->_vptr_IImage[3])
                    (local_68,(ulong)uVar10,(ulong)local_d0,&local_a4,(ulong)blend);
          __x = __x + (float)local_58._0_4_;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      local_d4 = local_d4 + local_48;
      local_d0 = local_d0 + 1;
    } while (local_d0 != (uint)local_70);
  }
  return;
}

Assistant:

void CImage::copyToScalingBoxFilter(IImage *target, s32 bias, bool blend)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScalingBoxFilter method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	const core::dimension2d<u32> destSize = target->getDimension();

	const f32 sourceXStep = (f32)Size.Width / (f32)destSize.Width;
	const f32 sourceYStep = (f32)Size.Height / (f32)destSize.Height;

	s32 fx = core::ceil32(sourceXStep);
	s32 fy = core::ceil32(sourceYStep);
	f32 sx;
	f32 sy;

	sy = 0.f;
	for (u32 y = 0; y != destSize.Height; ++y) {
		sx = 0.f;
		for (u32 x = 0; x != destSize.Width; ++x) {
			target->setPixel(x, y,
					getPixelBox(core::floor32(sx), core::floor32(sy), fx, fy, bias), blend);
			sx += sourceXStep;
		}
		sy += sourceYStep;
	}
}